

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiSettingsHandler * ImGui::FindSettingsHandler(char *type_name)

{
  ImGuiContext *pIVar1;
  ImU32 IVar2;
  ImGuiSettingsHandler *pIVar3;
  char *in_RDI;
  int handler_n;
  ImGuiID type_hash;
  ImGuiContext *g;
  int in_stack_ffffffffffffffdc;
  int iVar4;
  
  pIVar1 = GImGui;
  IVar2 = ImHashStr(in_RDI,0,0);
  iVar4 = 0;
  while( true ) {
    if ((pIVar1->SettingsHandlers).Size <= iVar4) {
      return (ImGuiSettingsHandler *)0x0;
    }
    pIVar3 = ImVector<ImGuiSettingsHandler>::operator[]
                       ((ImVector<ImGuiSettingsHandler> *)CONCAT44(IVar2,iVar4),
                        in_stack_ffffffffffffffdc);
    if (pIVar3->TypeHash == IVar2) break;
    iVar4 = iVar4 + 1;
  }
  pIVar3 = ImVector<ImGuiSettingsHandler>::operator[]
                     ((ImVector<ImGuiSettingsHandler> *)CONCAT44(IVar2,iVar4),
                      in_stack_ffffffffffffffdc);
  return pIVar3;
}

Assistant:

ImGuiSettingsHandler* ImGui::FindSettingsHandler(const char* type_name)
{
    ImGuiContext& g = *GImGui;
    const ImGuiID type_hash = ImHashStr(type_name);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].TypeHash == type_hash)
            return &g.SettingsHandlers[handler_n];
    return NULL;
}